

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fperror.h
# Opt level: O3

FPError * __thiscall
phyr::FPError::operator/(FPError *__return_storage_ptr__,FPError *this,FPError *fp)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  __return_storage_ptr__->v = this->v / fp->v;
  dVar2 = fp->lBound;
  dVar1 = fp->uBound;
  if ((0.0 <= dVar2) || (dVar1 <= 0.0)) {
    auVar3._0_8_ = this->lBound;
    auVar3._8_8_ = this->uBound;
    auVar4._8_8_ = dVar2;
    auVar4._0_8_ = dVar2;
    auVar4 = divpd(auVar3,auVar4);
    auVar5._8_8_ = dVar1;
    auVar5._0_8_ = dVar1;
    auVar3 = divpd(auVar3,auVar5);
    auVar5 = minpd(auVar3,auVar4);
    dVar2 = auVar5._8_8_;
    if (auVar5._0_8_ <= auVar5._8_8_) {
      dVar2 = auVar5._0_8_;
    }
    if (-INFINITY < dVar2) {
      dVar2 = (double)(~-(ulong)(dVar2 == 0.0) & (ulong)dVar2 |
                      -(ulong)(dVar2 == 0.0) & 0x8000000000000000);
      dVar2 = (double)((long)dVar2 + (ulong)(dVar2 <= 0.0) * 2 + -1);
    }
    else {
      dVar2 = -INFINITY;
    }
    __return_storage_ptr__->lBound = dVar2;
    auVar3 = maxpd(auVar3,auVar4);
    dVar2 = auVar3._8_8_;
    if (auVar3._8_8_ <= auVar3._0_8_) {
      dVar2 = auVar3._0_8_;
    }
    if (dVar2 < INFINITY) {
      dVar2 = (double)(~-(ulong)(dVar2 == 0.0) & (ulong)dVar2);
      dVar2 = (double)((-(ulong)(dVar2 < 0.0) | 1) + (long)dVar2);
      goto LAB_0010afb9;
    }
  }
  else {
    __return_storage_ptr__->lBound = -INFINITY;
  }
  dVar2 = INFINITY;
LAB_0010afb9:
  __return_storage_ptr__->uBound = dVar2;
  return __return_storage_ptr__;
}

Assistant:

FPError operator/(const FPError& fp) const {
        FPError ret;
        ret.v = v / fp.v;

        if (fp.lBound < 0 && fp.uBound > 0) {
            ret.lBound = -Infinity; ret.uBound = Infinity;
        } else {
            Real _b[4] = {
                lBound / fp.lBound, lBound / fp.uBound,
                uBound / fp.lBound, uBound / fp.uBound
            };
            ret.lBound = nextFloatDown(std::min(std::min(_b[0], _b[1]), std::min(_b[2], _b[3])));
            ret.uBound = nextFloatUp(std::max(std::max(_b[0], _b[1]), std::max(_b[2], _b[3])));
        }

        return ret;
    }